

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipcommunication.c
# Opt level: O0

int ipcmd_send_tcp(ipcmd_t *ipcmd,YPSpur_msg *data)

{
  ssize_t sVar1;
  size_t len;
  int sock;
  YPSpur_msg *data_local;
  ipcmd_t *ipcmd_local;
  
  if ((ipcmd == (ipcmd_t *)0x0) || (ipcmd->connection_error != 0)) {
    ipcmd_local._4_4_ = -1;
  }
  else {
    if (ipcmd->tcp_type == IPCMD_TCP_CLIENT) {
      len._4_4_ = ipcmd->socket;
    }
    else {
      len._4_4_ = ipcmd->clients[(int)data->msg_type];
    }
    sVar1 = send(len._4_4_,data,0x38,0);
    if (sVar1 < 0) {
      if (ipcmd->tcp_type == IPCMD_TCP_CLIENT) {
        shutdown(ipcmd->socket,2);
        ipcmd->connection_error = 1;
      }
      ipcmd_local._4_4_ = -1;
    }
    else {
      ipcmd_local._4_4_ = 0x38;
    }
  }
  return ipcmd_local._4_4_;
}

Assistant:

int ipcmd_send_tcp(struct ipcmd_t* ipcmd, YPSpur_msg* data)
{
  int sock;
  size_t len = sizeof(YPSpur_msg);

  if (ipcmd == NULL || ipcmd->connection_error)
    return -1;

  if (ipcmd->tcp_type == IPCMD_TCP_CLIENT)
  {
    sock = ipcmd->socket;
  }
  else
  {
    sock = ipcmd->clients[(int)data->msg_type];
  }
  if (send(sock, (SOCK_DATATYPE)data, len, 0) < 0)
  {
    if (ipcmd->tcp_type == IPCMD_TCP_CLIENT)
    {
      shutdown(ipcmd->socket, SOCK_SHUTDOWN_OPTION);
      ipcmd->connection_error = 1;
    }
    return -1;
  }

  return len;
}